

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O0

void __thiscall
NodeParser::parseEmitter
          (NodeParser *this,Node *node,Network *nw,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  InputError *this_00;
  allocator local_69;
  string local_68 [32];
  Pattern *local_48;
  Pattern *pattern;
  double expon;
  double coeff;
  Junction *junc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens_local;
  Network *nw_local;
  Node *node_local;
  NodeParser *this_local;
  
  junc = (Junction *)tokens;
  tokens_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)nw;
  nw_local = (Network *)node;
  node_local = (Node *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokens);
  if ((1 < sVar3) &&
     (iVar2 = (**(code **)((nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start + 4))(), iVar2 == 0)) {
    coeff = (double)nw_local;
    expon = 0.0;
    pattern = (Pattern *)Network::option((Network *)tokens_local,EMITTER_EXPONENT);
    local_48 = (Pattern *)0x0;
    parseEmitterData((Network *)tokens_local,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)junc,&expon,(double *)&pattern,(Pattern *)0x0);
    bVar1 = Emitter::addEmitter((Junction *)coeff,expon,(double)pattern,local_48);
    if (!bVar1) {
      this_00 = (InputError *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"Node Emitter",&local_69);
      InputError::InputError(this_00,1,(string *)local_68);
      __cxa_throw(this_00,&InputError::typeinfo,InputError::~InputError);
    }
  }
  return;
}

Assistant:

void NodeParser::parseEmitter(Node* node, Network* nw, vector<string>& tokens)
{
    // ... cast Node to Junction
    if ( tokens.size() < 2 ) return;
    if ( node->type() != Node::JUNCTION ) return;
    Junction* junc = static_cast<Junction*>(node);

    // ... read emitter's parameters
    double coeff = 0.0;
    double expon = nw->option(Options::EMITTER_EXPONENT);
    Pattern* pattern = 0;
    parseEmitterData(nw, tokens, coeff, expon, pattern);

    // ... add an emitter to the junction
    if ( !Emitter::addEmitter(junc, coeff, expon, pattern) )
    {
        throw InputError(InputError::CANNOT_CREATE_OBJECT, "Node Emitter");
    }
}